

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample_nearest_compute_blob.h
# Opt level: O1

void ncnn::gridsample_3d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)1,true>
               (Mat *src,Mat *grid,Mat *offset_value,int permute_fusion)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar4;
  undefined8 uVar3;
  undefined4 uVar5;
  int iVar6;
  void *pvVar7;
  size_t sVar8;
  size_t sVar9;
  int iVar10;
  int iVar11;
  undefined4 extraout_EDX;
  uint uVar12;
  undefined4 extraout_EDX_00;
  int iVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  int *piVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  uint uVar21;
  uint uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  
  iVar13 = grid->h * grid->w * grid->d;
  piVar17 = (int *)offset_value->data;
  if (permute_fusion == 0) {
    if (0 < grid->c) {
      sVar8 = grid->cstep;
      sVar9 = grid->elemsize;
      lVar15 = (long)grid->data + 8;
      lVar14 = 0;
      do {
        if (0 < iVar13) {
          lVar16 = 0;
          do {
            iVar6 = src->d;
            fVar20 = *(float *)(lVar15 + lVar16 * 4);
            uVar3 = *(undefined8 *)(lVar15 + -8 + lVar16 * 4);
            uVar2 = src->w;
            uVar5 = src->h;
            fVar19 = floorf((float)(uVar2 + -1) * ((float)uVar3 * 0.5 + 0.5) + 0.5);
            fVar18 = floorf((float)(uVar5 + -1) * ((float)((ulong)uVar3 >> 0x20) * 0.5 + 0.5) + 0.5)
            ;
            fVar20 = floorf((float)(iVar6 + -1) * (fVar20 * 0.5 + 0.5) + 0.5);
            iVar11 = (int)fVar20;
            iVar10 = -1;
            if ((iVar11 < iVar6) && (-1 < iVar11)) {
              uVar21 = (uint)fVar19;
              uVar22 = (uint)fVar18;
              auVar24._0_4_ = -(uint)((int)uVar21 < (int)uVar2);
              auVar24._4_4_ = auVar24._0_4_;
              auVar24._8_4_ = -(uint)((int)uVar22 < (int)uVar5);
              auVar24._12_4_ = -(uint)((int)uVar22 < (int)uVar5);
              uVar12 = movmskpd(extraout_EDX_00,auVar24);
              if (((byte)((byte)uVar12 >> 1) != 0) &&
                 (((uVar12 & 1) != 0 && (-1 < (int)(uVar22 | uVar21))))) {
                iVar10 = (uVar2 * (uVar5 * iVar11 + uVar22) + uVar21) * src->elempack;
              }
            }
            *piVar17 = iVar10;
            piVar17 = piVar17 + 1;
            lVar16 = lVar16 + 3;
          } while ((int)lVar16 < iVar13);
        }
        lVar14 = lVar14 + 1;
        lVar15 = lVar15 + sVar8 * sVar9;
      } while (lVar14 < grid->c);
    }
  }
  else if (0 < iVar13) {
    lVar14 = grid->elemsize * grid->cstep;
    pvVar7 = grid->data;
    lVar15 = 0;
    do {
      iVar6 = src->d;
      fVar20 = *(float *)((long)pvVar7 + lVar15 * 4 + lVar14 * 2);
      uVar1 = src->w;
      uVar4 = src->h;
      fVar19 = *(float *)((long)pvVar7 + lVar15 * 4 + lVar14);
      fVar18 = floorf((float)(uVar1 + -1) * (*(float *)((long)pvVar7 + lVar15 * 4) * 0.5 + 0.5) +
                      0.5);
      fVar19 = floorf((float)(uVar4 + -1) * (fVar19 * 0.5 + 0.5) + 0.5);
      fVar20 = floorf((float)(iVar6 + -1) * (fVar20 * 0.5 + 0.5) + 0.5);
      iVar11 = (int)fVar20;
      iVar10 = -1;
      if ((iVar11 < iVar6) && (-1 < iVar11)) {
        uVar21 = (uint)fVar18;
        uVar22 = (uint)fVar19;
        auVar23._0_4_ = -(uint)((int)uVar21 < (int)uVar1);
        auVar23._4_4_ = auVar23._0_4_;
        auVar23._8_4_ = -(uint)((int)uVar22 < (int)uVar4);
        auVar23._12_4_ = -(uint)((int)uVar22 < (int)uVar4);
        uVar12 = movmskpd(extraout_EDX,auVar23);
        if (((byte)((byte)uVar12 >> 1) != 0) &&
           (((uVar12 & 1) != 0 && (-1 < (int)(uVar22 | uVar21))))) {
          iVar10 = (uVar1 * (uVar4 * iVar11 + uVar22) + uVar21) * src->elempack;
        }
      }
      piVar17[lVar15] = iVar10;
      lVar15 = lVar15 + 1;
    } while (iVar13 != (int)lVar15);
  }
  return;
}

Assistant:

void gridsample_3d_nearest_compute_blob(const Mat& src, const Mat& grid, Mat& offset_value, int permute_fusion)
{
    const int grid_size = grid.w * grid.h * grid.d;

    float* offset_ptr = offset_value.channel(0);

    grid_sample_unormalize<align_corner> unormalize;
    compute_coord<pd, align_corner> get_coord;

    if (permute_fusion == 0)
    {
        for (int y = 0; y < grid.c; y++)
        {
            const float* gridptr = grid.channel(y);
            int x = 0;
#if __AVX__
            for (; x + 23 < grid_size; x += 24)
            {
                __m256 gx = _mm256_loadu_ps(gridptr);
                __m256 gy = _mm256_loadu_ps(gridptr + 8);
                __m256 gz = _mm256_loadu_ps(gridptr + 16);

                transpose3x8_ps(gx, gy, gz);

                gx = unormalize(_mm256_set1_ps(src.w), gx);
                gx = get_coord(_mm256_set1_ps(src.w), gx);

                gy = unormalize(_mm256_set1_ps(src.h), gy);
                gy = get_coord(_mm256_set1_ps(src.h), gy);

                gz = unormalize(_mm256_set1_ps(src.d), gz);
                gz = get_coord(_mm256_set1_ps(src.d), gz);

                gx = _mm256_floor_ps(_mm256_add_ps(gx, _mm256_set1_ps(0.5f)));
                gy = _mm256_floor_ps(_mm256_add_ps(gy, _mm256_set1_ps(0.5f)));
                gz = _mm256_floor_ps(_mm256_add_ps(gz, _mm256_set1_ps(0.5f)));

                __m256 v_in_range = _mm256_and_ps(_mm256_and_ps(_mm256_cmp_ps(gx, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.w), gx, _CMP_GT_OS)),
                                                  _mm256_and_ps(_mm256_cmp_ps(gy, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.h), gy, _CMP_GT_OS)));
                v_in_range = _mm256_and_ps(v_in_range, _mm256_and_ps(_mm256_cmp_ps(gz, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.d), gz, _CMP_GT_OS)));

                __m256 offset = _mm256_mul_ps(_mm256_comp_fmadd_ps(_mm256_mul_ps(_mm256_set1_ps(src.w), _mm256_set1_ps(src.h)), gz,
                                              _mm256_comp_fmadd_ps(gy, _mm256_set1_ps(src.w), gx)),
                                              _mm256_set1_ps(src.elempack));

                offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), _mm256_castsi256_ps(_mm256_cvtps_epi32(offset)), v_in_range);

                _mm256_storeu_ps(offset_ptr, offset);

                gridptr += 24;
                offset_ptr += 8;
            }

#endif // __AVX__

            for (; x < grid_size; x += 3)
            {
                float sample_x = *gridptr;
                float sample_y = *(gridptr + 1);
                float sample_z = *(gridptr + 2);

                sample_x = unormalize(src.w, sample_x);
                sample_x = get_coord(src.w, sample_x);

                sample_y = unormalize(src.h, sample_y);
                sample_y = get_coord(src.h, sample_y);

                sample_z = unormalize(src.d, sample_z);
                sample_z = get_coord(src.d, sample_z);

                int x0 = static_cast<int>(floorf(sample_x + 0.5f));
                int y0 = static_cast<int>(floorf(sample_y + 0.5f));
                int z0 = static_cast<int>(floorf(sample_z + 0.5f));

                bool in_bound = ((x0 > -1) & (x0 < src.w) & (y0 > -1) & (y0 < src.h) & (z0 > -1) & (z0 < src.d));

                int* iptr = (int*)offset_ptr;
                *iptr = in_bound ? (x0 + y0 * src.w + z0 * src.w * src.h) * src.elempack : -1.0;

                gridptr += 3;
                offset_ptr++;
            }
        }
    }
    else
    {
        const float* gridptr_x = grid.channel(0);
        const float* gridptr_y = grid.channel(1);
        const float* gridptr_z = grid.channel(2);

        int x = 0;
#if __AVX__
        for (; x + 7 < grid_size; x += 8)
        {
            __m256 gx = _mm256_loadu_ps(gridptr_x);
            __m256 gy = _mm256_loadu_ps(gridptr_y);
            __m256 gz = _mm256_loadu_ps(gridptr_z);

            gx = unormalize(_mm256_set1_ps(src.w), gx);
            gx = get_coord(_mm256_set1_ps(src.w), gx);

            gy = unormalize(_mm256_set1_ps(src.h), gy);
            gy = get_coord(_mm256_set1_ps(src.h), gy);

            gz = unormalize(_mm256_set1_ps(src.d), gz);
            gz = get_coord(_mm256_set1_ps(src.d), gz);

            gx = _mm256_floor_ps(_mm256_add_ps(gx, _mm256_set1_ps(0.5f)));
            gy = _mm256_floor_ps(_mm256_add_ps(gy, _mm256_set1_ps(0.5f)));
            gz = _mm256_floor_ps(_mm256_add_ps(gz, _mm256_set1_ps(0.5f)));

            __m256 v_in_range = _mm256_and_ps(_mm256_and_ps(_mm256_cmp_ps(gx, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.w), gx, _CMP_GT_OS)),
                                              _mm256_and_ps(_mm256_cmp_ps(gy, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.h), gy, _CMP_GT_OS)));
            v_in_range = _mm256_and_ps(v_in_range, _mm256_and_ps(_mm256_cmp_ps(gz, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.d), gz, _CMP_GT_OS)));

            __m256 offset = _mm256_mul_ps(_mm256_comp_fmadd_ps(_mm256_mul_ps(_mm256_set1_ps(src.w), _mm256_set1_ps(src.h)), gz,
                                          _mm256_comp_fmadd_ps(gy, _mm256_set1_ps(src.w), gx)),
                                          _mm256_set1_ps(src.elempack));

            offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), _mm256_castsi256_ps(_mm256_cvtps_epi32(offset)), v_in_range);

            _mm256_storeu_ps(offset_ptr, offset);

            gridptr_x += 8;
            gridptr_y += 8;
            gridptr_z += 8;

            offset_ptr += 8;
        }

#endif // __AVX__

        for (; x < grid_size; x++)
        {
            float sample_x = *gridptr_x;
            float sample_y = *gridptr_y;
            float sample_z = *gridptr_z;

            sample_x = unormalize(src.w, sample_x);
            sample_x = get_coord(src.w, sample_x);

            sample_y = unormalize(src.h, sample_y);
            sample_y = get_coord(src.h, sample_y);

            sample_z = unormalize(src.d, sample_z);
            sample_z = get_coord(src.d, sample_z);

            int x0 = static_cast<int>(floorf(sample_x + 0.5f));
            int y0 = static_cast<int>(floorf(sample_y + 0.5f));
            int z0 = static_cast<int>(floorf(sample_z + 0.5f));

            bool in_bound = ((x0 > -1) & (x0 < src.w) & (y0 > -1) & (y0 < src.h) & (z0 > -1) & (z0 < src.d));

            int* iptr = (int*)offset_ptr;
            *iptr = in_bound ? (x0 + y0 * src.w + z0 * src.w * src.h) * src.elempack : -1.0;

            gridptr_x++;
            gridptr_y++;
            gridptr_z++;

            offset_ptr++;
        }
    }
}